

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

void __thiscall wallet::InternalPage::Unserialize<AutoFile>(InternalPage *this,AutoFile *s)

{
  runtime_error *this_00;
  ulong uVar1;
  long lVar2;
  size_t nSize;
  uint uVar3;
  long lVar4;
  long in_FS_OFFSET;
  InternalRecord record;
  RecordHeader rec_hdr;
  uint16_t index;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  lVar4 = 0x10;
  lVar2 = -0x1c;
  do {
    if ((this->m_header).entries <= uVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
LAB_004aa971:
      __stack_chk_fail();
    }
    index = ser_readdata16<AutoFile>(s);
    if ((this->m_header).other_endian == true) {
      index = index << 8 | index >> 8;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(&this->indexes,&index);
    uVar1 = (ulong)index;
    nSize = lVar2 + uVar1;
    if ((long)nSize < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Internal record position not in page");
LAB_004aa90b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004aa971;
    }
    AutoFile::ignore(s,nSize);
    rec_hdr.other_endian = (this->m_header).other_endian;
    RecordHeader::Unserialize<AutoFile>(&rec_hdr,s);
    if (rec_hdr.type != KEYDATA) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unknown record type in internal page");
      goto LAB_004aa90b;
    }
    record.m_header.other_endian = rec_hdr.other_endian;
    record.m_header._5_1_ = rec_hdr._5_1_;
    record.m_header.len = rec_hdr.len;
    record.m_header.type = rec_hdr.type;
    record.m_header.deleted = rec_hdr.deleted;
    record.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    record.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    record.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    InternalRecord::Unserialize<AutoFile>(&record,s);
    std::vector<wallet::InternalRecord,std::allocator<wallet::InternalRecord>>::
    emplace_back<wallet::InternalRecord&>
              ((vector<wallet::InternalRecord,std::allocator<wallet::InternalRecord>> *)
               &this->records,&record);
    AutoFile::seek(s,lVar4 - (uVar1 + rec_hdr.len),1);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&record.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 2;
    lVar2 = lVar2 + -2;
  } while( true );
}

Assistant:

void Unserialize(Stream& s)
    {
        // Current position within the page
        int64_t pos = PageHeader::SIZE;

        // Get the items
        for (uint32_t i = 0; i < m_header.entries; ++i) {
            // Get the index
            uint16_t index;
            s >> index;
            if (m_header.other_endian) {
                index = internal_bswap_16(index);
            }
            indexes.push_back(index);
            pos += sizeof(uint16_t);

            // Go to the offset from the index
            int64_t to_jump = index - pos;
            if (to_jump < 0) {
                throw std::runtime_error("Internal record position not in page");
            }
            s.ignore(to_jump);

            // Read the record
            RecordHeader rec_hdr(m_header.other_endian);
            s >> rec_hdr;
            to_jump += RecordHeader::SIZE;

            if (rec_hdr.type != RecordType::KEYDATA) {
                throw std::runtime_error("Unknown record type in internal page");
            }
            InternalRecord record(rec_hdr);
            s >> record;
            records.emplace_back(record);
            to_jump += InternalRecord::FIXED_SIZE + rec_hdr.len;

            // Go back to the indexes
            s.seek(-to_jump, SEEK_CUR);
        }
    }